

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

_Bool golf_level_save(golf_level_t *level,char *path)

{
  float fVar1;
  undefined8 uVar2;
  vec2 v;
  uint uVar3;
  golf_material_t *pgVar4;
  golf_lightmap_image_t *pgVar5;
  golf_entity_t *pgVar6;
  int iVar7;
  golf_entity_type_t gVar8;
  JSON_Array *pJVar9;
  JSON_Value *pJVar10;
  JSON_Object *pJVar11;
  JSON_Value *pJVar12;
  JSON_Array *pJVar13;
  ulong uVar14;
  JSON_Array *array;
  JSON_Value *value;
  JSON_Object *pJVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  double number;
  vec3 v_00;
  vec3 v_01;
  vec3 v_02;
  vec3 v_03;
  vec4 v_04;
  quat q;
  float local_1a8;
  char *local_188;
  int aiStack_180 [2];
  char *local_178;
  JSON_Object *local_168;
  JSON_Value *local_160;
  char *local_158;
  int aiStack_150 [2];
  char *local_148;
  long local_140;
  vec_str_t local_138;
  JSON_Value *local_118;
  JSON_Value *local_110;
  JSON_Value *local_108;
  char *local_100;
  JSON_Value *local_f8;
  JSON_Object *local_f0;
  JSON_Value *local_e8;
  JSON_Array *local_e0;
  JSON_Value *local_d8;
  JSON_Value *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  long local_80;
  int local_78;
  uint local_68;
  long local_60;
  vec3 local_44;
  float fVar23;
  undefined8 uVar24;
  
  local_138.data = (char **)0x0;
  local_138.length = 0;
  local_138.capacity = 0;
  local_138.alloc_category = "level";
  local_100 = path;
  _add_dependency(&local_138,"data/textures/hole_lightmap.png");
  local_108 = json_value_init_array();
  pJVar9 = json_value_get_array(local_108);
  iVar20 = (level->materials).length;
  if (0 < iVar20) {
    lVar19 = 0x58;
    lVar21 = 0;
    do {
      pgVar4 = (level->materials).data;
      if (pgVar4->name[lVar19 + -0x59] != '\x01') goto LAB_0012b1bc;
      pJVar10 = json_value_init_object();
      pJVar11 = json_value_get_object(pJVar10);
      json_object_set_string(pJVar11,"name",pgVar4->name + lVar19 + -0x58);
      json_object_set_number(pJVar11,"friction",(double)*(float *)(pgVar4->name + lVar19 + -0x15));
      json_object_set_number
                (pJVar11,"restitution",(double)*(float *)(pgVar4->name + lVar19 + -0x11));
      json_object_set_number(pJVar11,"vel_scale",(double)*(float *)(pgVar4->name + lVar19 + -0xd));
      switch(*(undefined4 *)(pgVar4->name + lVar19 + -9)) {
      case 0:
        json_object_set_string(pJVar11,"type","texture");
        break;
      case 1:
        json_object_set_string(pJVar11,"type","color");
        uVar2 = *(undefined8 *)(pgVar4->name + lVar19 + -1);
        uVar24 = *(undefined8 *)(pgVar4->name + lVar19 + 7);
        goto LAB_0012b1a2;
      case 2:
        json_object_set_string(pJVar11,"type","diffuse_color");
        uVar2 = *(undefined8 *)(pgVar4->name + lVar19 + -1);
        uVar24 = *(undefined8 *)(pgVar4->name + lVar19 + 7);
LAB_0012b1a2:
        v_04.z = (float)(int)uVar24;
        v_04.w = (float)(int)((ulong)uVar24 >> 0x20);
        v_04.x = (float)(int)uVar2;
        v_04.y = (float)(int)((ulong)uVar2 >> 0x20);
        golf_json_object_set_vec4(pJVar11,"color",v_04);
        goto switchD_0012b0e4_default;
      case 3:
        json_object_set_string(pJVar11,"type","environment");
        break;
      default:
        goto switchD_0012b0e4_default;
      }
      json_object_set_string(pJVar11,"texture",pgVar4->name + lVar19 + -1);
      _add_dependency(&local_138,pgVar4->name + lVar19 + -1);
switchD_0012b0e4_default:
      json_array_append_value(pJVar9,pJVar10);
      iVar20 = (level->materials).length;
LAB_0012b1bc:
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x460;
    } while (lVar21 < iVar20);
  }
  local_110 = json_value_init_array();
  pJVar9 = json_value_get_array(local_110);
  iVar20 = (level->lightmap_images).length;
  if (0 < iVar20) {
    lVar19 = 0;
    do {
      pgVar5 = (level->lightmap_images).data;
      if (pgVar5[lVar19].active == true) {
        pJVar10 = json_value_init_object();
        pJVar11 = json_value_get_object(pJVar10);
        json_object_set_string(pJVar11,"name",pgVar5[lVar19].name);
        json_object_set_number(pJVar11,"resolution",(double)pgVar5[lVar19].resolution);
        json_object_set_number(pJVar11,"time_length",(double)pgVar5[lVar19].time_length);
        json_object_set_number(pJVar11,"num_samples",(double)pgVar5[lVar19].num_samples);
        json_object_set_boolean(pJVar11,"repeats",(uint)pgVar5[lVar19].repeats);
        pJVar12 = json_value_init_array();
        pJVar13 = json_value_get_array(pJVar12);
        if (0 < pgVar5[lVar19].num_samples) {
          lVar21 = 0;
          do {
            local_c8 = (uchar *)0x0;
            uStack_c0 = 0;
            local_b8 = "level";
            stbi_write_png_to_func
                      (_stbi_write_func,&local_c8,pgVar5[lVar19].width,pgVar5[lVar19].height,1,
                       pgVar5[lVar19].data[lVar21],pgVar5[lVar19].width);
            golf_json_array_append_data(pJVar13,local_c8,(int)uStack_c0);
            golf_free_tracked(local_c8);
            lVar21 = lVar21 + 1;
          } while (lVar21 < pgVar5[lVar19].num_samples);
        }
        json_object_set_value(pJVar11,"datas",pJVar12);
        json_array_append_value(pJVar9,pJVar10);
        iVar20 = (level->lightmap_images).length;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar20);
  }
  local_158 = (char *)0x0;
  aiStack_150[0] = 0;
  aiStack_150[1] = 0;
  local_148 = "level";
  if (0 < (level->entities).length) {
    lVar19 = 0;
    lVar21 = 0;
    iVar20 = 0;
    do {
      iVar7 = vec_expand_(&local_158,aiStack_150,aiStack_150 + 1,4,local_148);
      if (iVar7 == 0) {
        lVar16 = (long)aiStack_150[0];
        aiStack_150[0] = aiStack_150[0] + 1;
        *(int *)(local_158 + lVar16 * 4) = iVar20;
      }
      iVar20 = iVar20 + (uint)(byte)((level->entities).data)->name[lVar19 + -0xc];
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x510;
    } while (lVar21 < (level->entities).length);
  }
  local_118 = json_value_init_array();
  local_e0 = json_value_get_array(local_118);
  iVar20 = (level->entities).length;
  if (0 < iVar20) {
    lVar19 = 0;
    do {
      pgVar6 = (level->entities).data;
      lVar21 = lVar19;
      if (pgVar6[lVar19].active != true) goto LAB_0012bfa2;
      local_d0 = json_value_init_object();
      pJVar11 = json_value_get_object(local_d0);
      iVar20 = pgVar6[lVar19].parent_idx;
      if (-1 < (long)iVar20) {
        iVar20 = *(int *)(local_158 + (long)iVar20 * 4);
      }
      json_object_set_number(pJVar11,"parent_idx",(double)iVar20);
      json_object_set_string(pJVar11,"name",pgVar6[lVar19].name);
      uVar14 = (ulong)pgVar6[lVar19].type;
      switch(uVar14) {
      case 0:
        json_object_set_string(pJVar11,"type","model");
        pcVar18 = pgVar6[lVar19].field_4.model.model_path;
        json_object_set_string(pJVar11,"model",pcVar18);
        json_object_set_number(pJVar11,"uv_scale",(double)pgVar6[lVar19].field_4.model.uv_scale);
        json_object_set_boolean
                  (pJVar11,"ignore_physics",(uint)pgVar6[lVar19].field_4.model.ignore_physics);
        _add_dependency(&local_138,pcVar18);
        goto LAB_0012b629;
      case 1:
        pcVar18 = "ball-start";
        break;
      case 2:
        pcVar18 = "hole";
        break;
      case 3:
        pcVar18 = "geo";
        break;
      case 4:
        pcVar18 = "water";
        break;
      case 5:
        pcVar18 = "group";
        break;
      case 6:
        pcVar18 = "begin_animation";
        break;
      case 7:
        json_object_set_string(pJVar11,"type","camera_zone");
        json_object_set_boolean
                  (pJVar11,"towards_hole",
                   (uint)(byte)pgVar6[lVar19].field_4.geo.lightmap_section.lightmap_name[0]);
        goto LAB_0012b629;
      default:
        goto switchD_0012b4eb_default;
      }
      json_object_set_string(pJVar11,"type",pcVar18);
LAB_0012b629:
      uVar14 = (ulong)pgVar6[lVar19].type;
switchD_0012b4eb_default:
      if ((int)uVar14 == 3) {
        lVar21 = 0x100;
LAB_0012b65b:
        local_140 = lVar19;
        local_d8 = json_value_init_object();
        local_168 = json_value_get_object(local_d8);
        local_188 = (char *)0x0;
        aiStack_180[0] = 0;
        aiStack_180[1] = 0;
        local_178 = "geo";
        if (0 < *(int *)(pgVar6[lVar19].name + lVar21 + 0x1c)) {
          lVar16 = 0;
          lVar22 = 0;
          iVar20 = 0;
          do {
            iVar7 = vec_expand_(&local_188,aiStack_180,aiStack_180 + 1,4,local_178);
            if (iVar7 == 0) {
              lVar17 = (long)aiStack_180[0];
              aiStack_180[0] = aiStack_180[0] + 1;
              *(int *)(local_188 + lVar17 * 4) = iVar20;
            }
            iVar20 = iVar20 + (~*(uint *)(*(long *)(pgVar6[lVar19].name + lVar21 + 0x14) + lVar16) &
                              1);
            lVar22 = lVar22 + 1;
            lVar16 = lVar16 + 0x10;
          } while (lVar22 < *(int *)(pgVar6[lVar19].name + lVar21 + 0x1c));
        }
        pJVar10 = json_value_init_array();
        pJVar9 = json_value_get_array(pJVar10);
        iVar20 = *(int *)(pgVar6[lVar19].name + lVar21 + 0x1c);
        if (0 < iVar20) {
          lVar22 = 0xc;
          lVar16 = 0;
          do {
            lVar17 = *(long *)(pgVar6[lVar19].name + lVar21 + 0x14);
            if ((*(byte *)(lVar17 + -0xc + lVar22) & 1) != 0) {
              fVar23 = *(float *)(lVar17 + -4 + lVar22);
              fVar1 = *(float *)(lVar17 + lVar22);
              json_array_append_number(pJVar9,(double)*(float *)(lVar17 + -8 + lVar22));
              json_array_append_number(pJVar9,(double)fVar23);
              json_array_append_number(pJVar9,(double)fVar1);
              iVar20 = *(int *)(pgVar6[lVar19].name + lVar21 + 0x1c);
            }
            lVar16 = lVar16 + 1;
            lVar22 = lVar22 + 0x10;
          } while (lVar16 < iVar20);
        }
        json_object_set_value(local_168,"p",pJVar10);
        local_160 = json_value_init_array();
        pJVar9 = json_value_get_array(local_160);
        iVar20 = *(int *)(pgVar6[lVar19].name + lVar21 + 0x34);
        if (0 < iVar20) {
          lVar16 = 0;
          do {
            memcpy(&local_c8,
                   (void *)(lVar16 * 0x90 + *(long *)(pgVar6[lVar19].name + lVar21 + 0x2c)),0x90);
            if ((char)local_c8 == '\x01') {
              pJVar10 = json_value_init_array();
              pJVar13 = json_value_get_array(pJVar10);
              pJVar12 = json_value_init_array();
              array = json_value_get_array(pJVar12);
              if (0 < local_78) {
                lVar22 = 0;
                do {
                  iVar20 = *(int *)(local_80 + lVar22 * 4);
                  json_array_append_number
                            (pJVar13,(double)(iVar20 - *(int *)(local_188 + (long)iVar20 * 4)));
                  fVar23 = *(float *)(local_60 + 4 + lVar22 * 8);
                  json_array_append_number(array,(double)*(float *)(local_60 + lVar22 * 8));
                  json_array_append_number(array,(double)fVar23);
                  lVar22 = lVar22 + 1;
                } while (lVar22 < local_78);
              }
              value = json_value_init_object();
              pJVar15 = json_value_get_object(value);
              json_object_set_string(pJVar15,"material_name",(char *)((long)&local_c8 + 1));
              json_object_set_value(pJVar15,"idxs",pJVar10);
              json_object_set_value(pJVar15,"uvs",pJVar12);
              json_object_set_string
                        (pJVar15,"uv_gen_type",_golf_geo_face_uv_gen_type_strings[local_68]);
              json_array_append_value(pJVar9,value);
              golf_json_object_set_vec3(pJVar15,"water_dir",local_44);
              iVar20 = *(int *)(pgVar6[lVar19].name + lVar21 + 0x34);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < iVar20);
        }
        json_object_set_value(local_168,"faces",local_160);
        if (*(long *)(pgVar6[lVar19].name + lVar21 + -0xc) != 0) {
          local_e8 = json_value_init_object();
          local_f0 = json_value_get_object(local_e8);
          json_object_set_string(local_f0,"script",*(char **)(pgVar6[lVar19].name + lVar21 + -0xc));
          local_f8 = json_value_init_array();
          pJVar9 = json_value_get_array(local_f8);
          if (0 < *(int *)(pgVar6[lVar19].name + lVar21 + 4)) {
            lVar22 = 0;
            lVar16 = 0;
            do {
              pJVar10 = json_value_init_object();
              pJVar15 = json_value_get_object(pJVar10);
              json_object_set_string
                        (pJVar15,"name",
                         (char *)(*(long *)(pgVar6[lVar19].name + lVar21 + -4) + lVar22));
              lVar17 = *(long *)(pgVar6[lVar19].name + lVar21 + -4);
              uVar3 = *(uint *)(lVar17 + 0x40 + lVar22);
              if (0xb < uVar3) goto LAB_0012bb25;
              v = *(vec2 *)(lVar17 + 0x48 + lVar22);
              local_1a8 = v.x;
              switch(uVar3) {
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                              ,0x1ae,
                              "void _golf_json_object_set_geo(JSON_Object *, const char *, golf_geo_t *)"
                             );
              case 1:
                json_object_set_string(pJVar15,"type","bool");
                local_1a8 = (float)((uint)local_1a8 & 1);
                goto LAB_0012bb0f;
              case 2:
                json_object_set_string(pJVar15,"type","int");
LAB_0012bb0f:
                number = (double)(int)local_1a8;
LAB_0012bb16:
                json_object_set_number(pJVar15,"val",number);
                break;
              case 3:
                json_object_set_string(pJVar15,"type","float");
                number = (double)local_1a8;
                goto LAB_0012bb16;
              case 4:
                json_object_set_string(pJVar15,"type","vec2");
                golf_json_object_set_vec2(pJVar15,"val",v);
                break;
              case 5:
                local_160 = (JSON_Value *)
                            CONCAT44(local_160._4_4_,*(undefined4 *)(lVar17 + 0x50 + lVar22));
                json_object_set_string(pJVar15,"type","vec3");
                v_00.z = local_160._0_4_;
                v_00.x = v.x;
                v_00.y = v.y;
                golf_json_object_set_vec3(pJVar15,"val",v_00);
              }
LAB_0012bb25:
              json_array_append_value(pJVar9,pJVar10);
              lVar16 = lVar16 + 1;
              lVar22 = lVar22 + 0x58;
            } while (lVar16 < *(int *)(pgVar6[lVar19].name + lVar21 + 4));
          }
          json_object_set_value(local_f0,"args",local_f8);
          json_object_set_value(local_168,"generator_data",local_e8);
        }
        json_object_set_value(pJVar11,"geo",local_d8);
        golf_free_tracked(local_188);
        uVar14 = (ulong)pgVar6[lVar19].type;
        lVar21 = local_140;
      }
      else if ((int)uVar14 == 4) {
        lVar21 = 0xd8;
        goto LAB_0012b65b;
      }
      gVar8 = (golf_entity_type_t)uVar14;
      if (gVar8 < 8) {
        lVar16 = *(long *)(&DAT_00200780 + uVar14 * 8);
        pJVar10 = json_value_init_object();
        pJVar15 = json_value_get_object(pJVar10);
        v_01.z = *(float *)(pgVar6[lVar19].name + lVar16 + -4);
        v_01._0_8_ = *(undefined8 *)(pgVar6[lVar19].name + lVar16 + -0xc);
        golf_json_object_set_vec3(pJVar15,"position",v_01);
        v_02.z = *(float *)(pgVar6[lVar19].name + lVar16 + 0x18);
        v_02._0_8_ = *(undefined8 *)(pgVar6[lVar19].name + lVar16 + 0x10);
        golf_json_object_set_vec3(pJVar15,"scale",v_02);
        q._8_8_ = *(undefined8 *)(pgVar6[lVar19].name + lVar16 + 8);
        q._0_8_ = *(undefined8 *)(pgVar6[lVar19].name + lVar16);
        golf_json_object_set_quat(pJVar15,"rotation",q);
        json_object_set_value(pJVar11,"transform",pJVar10);
        gVar8 = pgVar6[lVar19].type;
      }
      if (gVar8 == MODEL_ENTITY) {
        lVar16 = 0x78;
LAB_0012bc80:
        pJVar10 = json_value_init_object();
        pJVar15 = json_value_get_object(pJVar10);
        json_object_set_string(pJVar15,"lightmap_name",pgVar6[lVar19].name + lVar16 + -0xc);
        golf_json_object_set_float_array
                  (pJVar15,"uvs",*(float **)(pgVar6[lVar19].name + lVar16 + 0x34),
                   *(int *)(pgVar6[lVar19].name + lVar16 + 0x3c) * 2,0.0,1.0);
        json_object_set_value(pJVar11,"lightmap_section",pJVar10);
        gVar8 = pgVar6[lVar19].type;
      }
      else if ((gVar8 == WATER_ENTITY) || (gVar8 == GEO_ENTITY)) {
        lVar16 = 0x50;
        goto LAB_0012bc80;
      }
      if ((gVar8 != GEO_ENTITY) && (gVar8 != MODEL_ENTITY)) goto LAB_0012bf85;
      pJVar10 = json_value_init_object();
      pJVar15 = json_value_get_object(pJVar10);
      switch(pgVar6[lVar19].field_4.model.movement.type) {
      case GOLF_MOVEMENT_NONE:
        json_object_set_string(pJVar15,"type","none");
        break;
      case GOLF_MOVEMENT_LINEAR:
        json_object_set_string(pJVar15,"type","linear");
        json_object_set_number
                  (pJVar15,"t0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x90));
        json_object_set_number
                  (pJVar15,"length",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x94));
        golf_json_object_set_vec3(pJVar15,"p0",*(vec3 *)((long)&pgVar6[lVar19].field_4 + 0x98));
        uVar24 = *(undefined8 *)
                  ((long)&pgVar6[lVar19].field_4.water.geo.generator_data.args.alloc_category + 4);
        fVar23 = pgVar6[lVar19].field_4.model.movement.field_4.linear.p1.z;
        pcVar18 = "p1";
        goto LAB_0012bf6c;
      case GOLF_MOVEMENT_SPINNER:
        json_object_set_string(pJVar15,"type","spinner");
        json_object_set_number
                  (pJVar15,"t0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x90));
        json_object_set_number
                  (pJVar15,"length",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x94));
        break;
      case GOLF_MOVEMENT_PENDULUM:
        json_object_set_string(pJVar15,"type","pendulum");
        json_object_set_number
                  (pJVar15,"t0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x90));
        json_object_set_number
                  (pJVar15,"length",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x94));
        json_object_set_number
                  (pJVar15,"theta0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x98));
        uVar24 = *(undefined8 *)&pgVar6[lVar19].field_4.water.geo.generator_data.args.capacity;
        fVar23 = pgVar6[lVar19].field_4.model.movement.field_4.linear.p1.x;
        goto LAB_0012bed5;
      case GOLF_MOVEMENT_RAMP:
        json_object_set_string(pJVar15,"type","ramp");
        json_object_set_number
                  (pJVar15,"t0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x90));
        json_object_set_number
                  (pJVar15,"length",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x94));
        json_object_set_number
                  (pJVar15,"theta0",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x98));
        json_object_set_number
                  (pJVar15,"theta1",(double)*(float *)((long)&pgVar6[lVar19].field_4 + 0x9c));
        json_object_set_number
                  (pJVar15,"transition_length",
                   (double)*(float *)((long)&pgVar6[lVar19].field_4 + 0xa0));
        uVar24 = *(undefined8 *)
                  ((long)&pgVar6[lVar19].field_4.water.geo.generator_data.args.alloc_category + 4);
        fVar23 = pgVar6[lVar19].field_4.model.movement.field_4.linear.p1.z;
LAB_0012bed5:
        pcVar18 = "axis";
LAB_0012bf6c:
        v_03.z = fVar23;
        v_03.x = (float)(int)uVar24;
        v_03.y = (float)(int)((ulong)uVar24 >> 0x20);
        golf_json_object_set_vec3(pJVar15,pcVar18,v_03);
      }
      json_object_set_value(pJVar11,"movement",pJVar10);
LAB_0012bf85:
      json_array_append_value(local_e0,local_d0);
      iVar20 = (level->entities).length;
LAB_0012bfa2:
      lVar19 = lVar21 + 1;
    } while (lVar19 < iVar20);
  }
  golf_free_tracked(local_158);
  pJVar10 = json_value_init_array();
  pJVar9 = json_value_get_array(pJVar10);
  if (0 < local_138.length) {
    lVar19 = 0;
    do {
      json_array_append_string(pJVar9,local_138.data[lVar19]);
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_138.length);
  }
  golf_free_tracked(local_138.data);
  pJVar12 = json_value_init_object();
  pJVar11 = json_value_get_object(pJVar12);
  json_object_set_value(pJVar11,"data_dependencies",pJVar10);
  json_object_set_value(pJVar11,"materials",local_108);
  json_object_set_value(pJVar11,"lightmap_images",local_110);
  json_object_set_value(pJVar11,"entities",local_118);
  json_serialize_to_file_pretty(pJVar12,local_100);
  json_value_free(pJVar12);
  return true;
}

Assistant:

bool golf_level_save(golf_level_t *level, const char *path) {
    vec_str_t data_dependencies;
    vec_init(&data_dependencies, "level");
    _add_dependency(&data_dependencies, "data/textures/hole_lightmap.png");

    JSON_Value *json_materials_val = json_value_init_array();
    JSON_Array *json_materials_arr = json_value_get_array(json_materials_val);
    for (int i = 0; i < level->materials.length; i++) {
        golf_material_t *material = &level->materials.data[i];
        if (!material->active) continue;

        JSON_Value *json_material_val = json_value_init_object();
        JSON_Object *json_material_obj = json_value_get_object(json_material_val);
        json_object_set_string(json_material_obj, "name", material->name);
        json_object_set_number(json_material_obj, "friction", material->friction);
        json_object_set_number(json_material_obj, "restitution", material->restitution);
        json_object_set_number(json_material_obj, "vel_scale", material->vel_scale);

        switch (material->type) {
            case GOLF_MATERIAL_TEXTURE: {
                json_object_set_string(json_material_obj, "type", "texture");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
            case GOLF_MATERIAL_COLOR: {
                json_object_set_string(json_material_obj, "type", "color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_DIFFUSE_COLOR: {
                json_object_set_string(json_material_obj, "type", "diffuse_color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_ENVIRONMENT: {
                json_object_set_string(json_material_obj, "type", "environment");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
        }

        json_array_append_value(json_materials_arr, json_material_val);
    }

    JSON_Value *json_lightmap_images_val = json_value_init_array();
    JSON_Array *json_lightmap_images_arr = json_value_get_array(json_lightmap_images_val);
    for (int i = 0; i < level->lightmap_images.length; i++) {
        golf_lightmap_image_t *lightmap_image = &level->lightmap_images.data[i];
        if (!lightmap_image->active) continue;

        JSON_Value *json_lightmap_image_val = json_value_init_object();
        JSON_Object *json_lightmap_image_obj = json_value_get_object(json_lightmap_image_val);
        json_object_set_string(json_lightmap_image_obj, "name", lightmap_image->name);
        json_object_set_number(json_lightmap_image_obj, "resolution", lightmap_image->resolution);
        json_object_set_number(json_lightmap_image_obj, "time_length", lightmap_image->time_length);
        json_object_set_number(json_lightmap_image_obj, "num_samples", lightmap_image->num_samples);
        json_object_set_boolean(json_lightmap_image_obj, "repeats", lightmap_image->repeats);

        JSON_Value *datas_val = json_value_init_array();
        JSON_Array *datas_arr = json_value_get_array(datas_val);
        for (int s = 0; s < lightmap_image->num_samples; s++) {
            vec_char_t png_data;
            vec_init(&png_data, "level");
            stbi_write_png_to_func(_stbi_write_func, &png_data, lightmap_image->width, lightmap_image->height, 1, lightmap_image->data[s], lightmap_image->width);
            golf_json_array_append_data(datas_arr, (unsigned char*)png_data.data, sizeof(unsigned char) * png_data.length);
            vec_deinit(&png_data);
        }
        json_object_set_value(json_lightmap_image_obj, "datas", datas_val);

        json_array_append_value(json_lightmap_images_arr, json_lightmap_image_val);
    }

    vec_int_t entity_saved_idx;
    vec_init(&entity_saved_idx, "level");
    {
        int saved_idx = 0;
        for (int i = 0; i < level->entities.length; i++) {
            vec_push(&entity_saved_idx, saved_idx);
            if (level->entities.data[i].active) saved_idx++;
        }
    }

    JSON_Value *json_entities_val = json_value_init_array();
    JSON_Array *json_entities_arr = json_value_get_array(json_entities_val);
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (!entity->active) continue;

        JSON_Value *json_entity_val = json_value_init_object();
        JSON_Object *json_entity_obj = json_value_get_object(json_entity_val);

        int parent_idx = entity->parent_idx;
        if (parent_idx >= 0) {
            parent_idx = entity_saved_idx.data[parent_idx];
        }
        json_object_set_number(json_entity_obj, "parent_idx", parent_idx);
        json_object_set_string(json_entity_obj, "name", entity->name);
        switch (entity->type) {
            case MODEL_ENTITY: {
                golf_model_entity_t *model = &entity->model;
                json_object_set_string(json_entity_obj, "type", "model");
                json_object_set_string(json_entity_obj, "model", model->model_path);
                json_object_set_number(json_entity_obj, "uv_scale", model->uv_scale);
                json_object_set_boolean(json_entity_obj, "ignore_physics", model->ignore_physics);
                _add_dependency(&data_dependencies, model->model_path);
                break;
            }
            case BALL_START_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "ball-start");
                break;
            }
            case HOLE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "hole");
                break;
            }
            case GEO_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "geo");
                break;
            }
            case GROUP_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "group");
                break;
            }
            case WATER_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "water");
                break;
            }
            case BEGIN_ANIMATION_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "begin_animation");
                break;
            }
            case CAMERA_ZONE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "camera_zone");
                json_object_set_boolean(json_entity_obj, "towards_hole", entity->camera_zone.towards_hole);
                break;
            }
        }

        golf_geo_t *geo = golf_entity_get_geo(entity);
        if (geo) {
            _golf_json_object_set_geo(json_entity_obj, "geo", geo);
        }

        golf_transform_t *transform = golf_entity_get_transform(entity);
        if (transform) {
            _golf_json_object_set_transform(json_entity_obj, "transform", transform);
        }

        golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
        if (lightmap_section) {
            _golf_json_object_set_lightmap_section(json_entity_obj, "lightmap_section", lightmap_section);
        }

        golf_movement_t *movement = golf_entity_get_movement(entity);
        if (movement) {
            _golf_json_object_set_movement(json_entity_obj, "movement", movement);
        }

        json_array_append_value(json_entities_arr, json_entity_val);
    }

    vec_deinit(&entity_saved_idx);

    JSON_Value *json_data_dependencies_val = json_value_init_array();
    JSON_Array *json_data_dependencies_arr = json_value_get_array(json_data_dependencies_val);
    for (int i = 0; i < data_dependencies.length; i++) {
        json_array_append_string(json_data_dependencies_arr, data_dependencies.data[i]);
    }
    vec_deinit(&data_dependencies);

    JSON_Value *json_val = json_value_init_object();
    JSON_Object *json_obj = json_value_get_object(json_val);
    json_object_set_value(json_obj, "data_dependencies", json_data_dependencies_val);
    json_object_set_value(json_obj, "materials", json_materials_val);
    json_object_set_value(json_obj, "lightmap_images", json_lightmap_images_val);
    json_object_set_value(json_obj, "entities", json_entities_val);
    json_serialize_to_file_pretty(json_val, path);
    json_value_free(json_val);
    return true;
}